

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add.c
# Opt level: O1

int linkedlist_add(s_linkedlist *linked_list,uint index,void *element)

{
  s_linkedlist_node *psVar1;
  int iVar2;
  s_linkedlist_node *psVar3;
  
  if (index == 0) {
    iVar2 = linkedlist_add_front(linked_list,element);
    return iVar2;
  }
  psVar3 = linked_list->head;
  if (psVar3 != (s_linkedlist_node *)0x0) {
    iVar2 = index + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        psVar1 = (s_linkedlist_node *)malloc(0x18);
        if (psVar1 == (s_linkedlist_node *)0x0) {
          return -1;
        }
        psVar1->previous = (s_linkedlist_node *)0x0;
        psVar1->next = (s_linkedlist_node *)0x0;
        psVar1->element = element;
        psVar1->previous = psVar3->previous;
        psVar1->next = psVar3;
        if (psVar3->previous != (s_linkedlist_node *)0x0) {
          psVar3->previous->next = psVar1;
        }
        psVar3->previous = psVar1;
        linked_list->size = linked_list->size + 1;
        return 0;
      }
      psVar3 = psVar3->next;
    } while (psVar3 != (s_linkedlist_node *)0x0);
  }
  return -1;
}

Assistant:

int linkedlist_add(s_linkedlist *linked_list, unsigned int index, void *element) {
    s_linkedlist_node *node = linked_list->head;

    if (index == 0) {
        return linkedlist_add_front(linked_list, element);
    } else {
        while (node != NULL) {
            if (index == 0) {
                s_linkedlist_node *node_to_insert = malloc(sizeof(s_linkedlist_node));
                if (node_to_insert == NULL) {
                    return (LINKEDLIST_RETVAL_FAILURE);
                }

                memset(node_to_insert, 0, sizeof(s_linkedlist_node));

                node_to_insert->element  = element;
                node_to_insert->previous = node->previous;
                node_to_insert->next     = node;
                if (node->previous != NULL) {
                    node->previous->next = node_to_insert;
                }
                node->previous           = node_to_insert;

                linked_list->size += 1;
                return (LINKEDLIST_RETVAL_SUCCESS);
            }

            index -= 1;
            node = node->next;
        }
    }

    return (LINKEDLIST_RETVAL_FAILURE);
}